

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

VkResult vkb::detail::
         get_vector<VkImage_T*,VkResult(*&)(VkDevice_T*,VkSwapchainKHR_T*,unsigned_int*,VkImage_T**),VkDevice_T*&,VkSwapchainKHR_T*&>
                   (vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *out,
                   _func_VkResult_VkDevice_T_ptr_VkSwapchainKHR_T_ptr_uint_ptr_VkImage_T_ptr_ptr **f
                   ,VkDevice_T **ts,VkSwapchainKHR_T **ts_1)

{
  VkDevice_T *pVVar1;
  VkSwapchainKHR_T *pVVar2;
  VkSwapchainKHR_T *pVVar3;
  VkResult VVar4;
  VkImage_T **ppVVar5;
  uint local_34;
  VkResult err;
  uint32_t count;
  VkSwapchainKHR_T **ts_local_1;
  VkDevice_T **ts_local;
  _func_VkResult_VkDevice_T_ptr_VkSwapchainKHR_T_ptr_uint_ptr_VkImage_T_ptr_ptr **f_local;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *out_local;
  
  local_34 = 0;
  _err = ts_1;
  ts_local_1 = (VkSwapchainKHR_T **)ts;
  ts_local = (VkDevice_T **)f;
  f_local = (_func_VkResult_VkDevice_T_ptr_VkSwapchainKHR_T_ptr_uint_ptr_VkImage_T_ptr_ptr **)out;
  do {
    VVar4 = (*(code *)*ts_local)(*ts_local_1,*_err,&local_34,0);
    if (VVar4 != VK_SUCCESS) {
      return VVar4;
    }
    std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::resize
              ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)f_local,(ulong)local_34);
    pVVar1 = *ts_local;
    pVVar2 = *ts_local_1;
    pVVar3 = *_err;
    ppVVar5 = std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::data
                        ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)f_local);
    VVar4 = (*(code *)pVVar1)(pVVar2,pVVar3,&local_34,ppVVar5);
    std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::resize
              ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)f_local,(ulong)local_34);
  } while (VVar4 == VK_INCOMPLETE);
  return VVar4;
}

Assistant:

auto get_vector(std::vector<T>& out, F&& f, Ts&&... ts) -> VkResult {
    uint32_t count = 0;
    VkResult err;
    do {
        err = f(ts..., &count, nullptr);
        if (err != VK_SUCCESS) {
            return err;
        };
        out.resize(count);
        err = f(ts..., &count, out.data());
        out.resize(count);
    } while (err == VK_INCOMPLETE);
    return err;
}